

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
::emplace_back<std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>>
          (StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
           *this,unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
                 *args)

{
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *in_RDI;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *unaff_retaddr;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *__u;
  
  __u = in_RDI;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  ::blockCheck(unaff_retaddr);
  *(int *)&in_RDI[3]._M_t.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl =
       *(int *)&in_RDI[3]._M_t.
                super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
                .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl + 1;
  std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>::
  unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>,void>
            ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)unaff_retaddr,__u);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl =
       (CloningFilter *)
       ((long)&(((in_RDI->_M_t).
                 super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
                 .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl)->super_Filter)
               .super_Interface + 1);
  return;
}

Assistant:

void emplace_back(Args&&... args)
        {
            blockCheck();
            new (&(dataptr[dataSlotIndex][bsize++]))
                X(std::forward<Args>(args)...);
            ++csize;
        }